

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

ResetOrderMap * __thiscall
libcellml::Validator::ValidatorImpl::buildModelResetOrderMap
          (ResetOrderMap *__return_storage_ptr__,ValidatorImpl *this,ModelPtr *model)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  ulong uVar3;
  ComponentPtr component;
  ComponentEntity local_40;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar3 = 0;
  while( true ) {
    sVar2 = ComponentEntity::componentCount
                      (&((model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_ComponentEntity);
    if (sVar2 <= uVar3) break;
    ComponentEntity::component
              (&local_40,
               (size_t)(model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
    traverseComponentTree(this,(ComponentPtr *)&local_40,__return_storage_ptr__);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    uVar3 = uVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

ResetOrderMap Validator::ValidatorImpl::buildModelResetOrderMap(const ModelPtr &model)
{
    ResetOrderMap resetOrderMap;
    for (size_t i = 0; i < model->componentCount(); ++i) {
        auto component = model->component(i);
        traverseComponentTree(component, resetOrderMap);
    }

    return resetOrderMap;
}